

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter-base.hxx
# Opt level: O0

StateVector * __thiscall
stateObservation::compileTime::KalmanFilterBase<4U,_3U,_0U>::oneStepEstimation_
          (StateVector *__return_storage_ptr__,KalmanFilterBase<4U,_3U,_0U> *this)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  size_type sVar4;
  reference pvVar5;
  bool *pbVar6;
  Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_0> local_608;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
  local_5f3 [3];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_0>_>
  local_5f0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_0>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_5d0;
  MatrixT local_5a8;
  Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_520;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  local_510;
  XprTypeNested local_4f0;
  non_const_type local_4e8;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_0>
  local_4e0;
  Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  local_4d0;
  Matrix<double,4,3,0,4,3> local_4b8 [8];
  Kmatrix kGain;
  MatrixT local_450;
  non_const_type local_408;
  Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0> local_400;
  Product<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_0>
  local_3f0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_0>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_3d8;
  Matrix<double,3,3,0,3,3> local_3b0 [8];
  Rmatrix inoCov;
  MatrixT local_350;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_338;
  Matrix<double,3,1,0,3,1> local_320 [8];
  MeasureVector ino;
  non_const_type local_280;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0> local_278;
  Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>
  local_268;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  local_250;
  Matrix<double,4,4,0,4,4> local_228 [8];
  Pmatrix pbar;
  StateVector xbar;
  Pmatrix px;
  Cmatrix c;
  Amatrix a;
  uint k;
  KalmanFilterBase<4U,_3U,_0U> *this_local;
  StateVector *xhat;
  
  puVar3 = IndexedMatrix<4U,_1U>::getTime(&(this->super_ZeroDelayObserver<4U,_3U,_0U>).x_);
  uVar1 = *puVar3;
  sVar4 = std::
          deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
          ::size(&(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_);
  bVar2 = false;
  if (sVar4 != 0) {
    pvVar5 = std::
             deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
             ::operator[](&(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_,0);
    puVar3 = IndexedMatrix<3U,_1U>::getTime(pvVar5);
    bVar2 = false;
    if (*puVar3 == uVar1 + 1) {
      bVar2 = true;
    }
  }
  if (!bVar2) {
    __assert_fail("this->y_.size()> 0 && this->y_[0].getTime()==k+1 && \"ERROR: The measurement vector is not set\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                  ,0x41,
                  "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                 );
  }
  pbVar6 = IndexedMatrix<4U,_4U>::isSet(&this->a_);
  if ((*pbVar6 & 1U) == 0) {
    __assert_fail("a_.isSet() && \"ERROR: The Matrix A is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                  ,0x45,
                  "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                 );
  }
  pbVar6 = IndexedMatrix<3U,_4U>::isSet(&this->c_);
  if ((*pbVar6 & 1U) == 0) {
    __assert_fail("c_.isSet() && \"ERROR: The Matrix C is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                  ,0x46,
                  "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                 );
  }
  pbVar6 = IndexedMatrix<4U,_4U>::isSet(&this->q_);
  if ((*pbVar6 & 1U) == 0) {
    __assert_fail("q_.isSet() && \"ERROR: The Matrix Q is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                  ,0x47,
                  "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                 );
  }
  pbVar6 = IndexedMatrix<3U,_3U>::isSet(&this->r_);
  if ((*pbVar6 & 1U) == 0) {
    __assert_fail("r_.isSet() && \"ERROR: The Matrix R is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                  ,0x48,
                  "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                 );
  }
  pbVar6 = IndexedMatrix<4U,_4U>::isSet(&this->p_);
  if ((*pbVar6 & 1U) == 0) {
    __assert_fail("p_.isSet() && \"ERROR: The Matrix P is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                  ,0x49,
                  "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                 );
  }
  IndexedMatrix<4U,_4U>::operator()
            ((MatrixT *)
             (c.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
             + 0xb),&this->a_);
  IndexedMatrix<3U,_4U>::operator()
            ((MatrixT *)
             (px.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),&this->c_);
  IndexedMatrix<4U,_4U>::operator()
            ((MatrixT *)
             (xbar.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3),&this->p_);
  (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>._vptr_ObserverBase
    [0x17])(pbar.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
            + 0xf,this,(ulong)(uVar1 + 1));
  local_278 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                         (c.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                          m_data.array + 0xb),
                         (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                         (xbar.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                          m_storage.m_data.array + 3));
  local_280 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                         (c.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                          m_data.array + 0xb));
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>>::
  operator*(&local_268,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>>
             *)&local_278,
            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)&local_280);
  IndexedMatrix<4U,_4U>::operator()
            ((MatrixT *)
             (ino.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),&this->q_);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>,0>>
  ::operator+(&local_250,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>,0>>
               *)&local_268,
              (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
              (ino.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 2));
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>,0>const,Eigen::Matrix<double,4,4,0,4,4>const>>
            (local_228,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)&local_250);
  pvVar5 = std::
           deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
           ::operator[](&(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_,0);
  IndexedMatrix<3U,_1U>::operator()(&local_350,pvVar5);
  (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>._vptr_ObserverBase
    [0x18])(inoCov.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + 8,this,
            pbar.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
            + 0xf,(ulong)(uVar1 + 1));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_338,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_350,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (inoCov.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 8));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_320,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_338);
  local_400 = Eigen::MatrixBase<Eigen::Matrix<double,3,4,0,3,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,4,0,3,4>> *)
                         (px.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                          m_data.array + 0xf),
                         (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_228);
  local_408 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                         (px.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                          m_data.array + 0xf));
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,4,0,4,4>,0>>::
  operator*(&local_3f0,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,4,0,4,4>,0>>
             *)&local_400,
            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_> *)&local_408);
  IndexedMatrix<3U,_3U>::operator()(&local_450,&this->r_);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>>
  ::operator+(&local_3d8,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>>
               *)&local_3f0,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_450);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>const,Eigen::Matrix<double,3,3,0,3,3>const>>
            (local_3b0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_0>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_3d8);
  local_4e8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                         (px.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                          m_data.array + 0xf));
  local_4e0 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_228,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_> *)
                         &local_4e8);
  local_4f0 = (XprTypeNested)
              Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse
                        ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_3b0);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>>
  ::operator*(&local_4d0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>>
               *)&local_4e0,
              (MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)&local_4f0);
  Eigen::Matrix<double,4,3,0,4,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            (local_4b8,&local_4d0);
  local_520 = Eigen::MatrixBase<Eigen::Matrix<double,4,3,0,4,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,3,0,4,3>> *)local_4b8,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_320);
  Eigen::MatrixBase<Eigen::Matrix<double,4,1,0,4,1>>::operator+
            (&local_510,
             (MatrixBase<Eigen::Matrix<double,4,1,0,4,1>> *)
             (pbar.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xf),
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_520);
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::Product<Eigen::Matrix<double,4,3,0,4,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            ((Matrix<double,4,1,0,4,1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)&local_510);
  IndexedMatrix<4U,_1U>::set
            (&(this->super_ZeroDelayObserver<4U,_3U,_0U>).x_,__return_storage_ptr__,uVar1 + 1);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  local_608 = Eigen::MatrixBase<Eigen::Matrix<double,4,3,0,4,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,3,0,4,3>> *)local_4b8,
                         (MatrixBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                         (px.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                          m_data.array + 0xf));
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
  ::operator-(&local_5f0,local_5f3,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_0>_>
               *)&local_608);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const,Eigen::Product<Eigen::Matrix<double,4,3,0,4,3>,Eigen::Matrix<double,3,4,0,3,4>,0>const>>
  ::operator*(&local_5d0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const,Eigen::Product<Eigen::Matrix<double,4,3,0,4,3>,Eigen::Matrix<double,3,4,0,3,4>,0>const>>
               *)&local_5f0,(MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_228);
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const,Eigen::Product<Eigen::Matrix<double,4,3,0,4,3>,Eigen::Matrix<double,3,4,0,3,4>,0>const>,Eigen::Matrix<double,4,4,0,4,4>,0>>
            ((Matrix<double,4,4,0,4,4> *)&local_5a8,
             (EigenBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_0>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
              *)&local_5d0);
  IndexedMatrix<4U,_4U>::set(&this->p_,&local_5a8,uVar1 + 1);
  return __return_storage_ptr__;
}

Assistant:

typename ObserverBase<n,m,p>::StateVector KalmanFilterBase<n,m,p>::oneStepEstimation_()
{
    unsigned k=this->x_.getTime();
    BOOST_ASSERT(this->y_.size()> 0 && this->y_[0].getTime()==k+1 && "ERROR: The measurement vector is not set");
    if (p>0)
        BOOST_ASSERT(this->u_.size()> 0 && this->u_[0].getTime()==k && "ERROR: The input vector is not set");

    BOOST_ASSERT(a_.isSet() && "ERROR: The Matrix A is not initialized" );
    BOOST_ASSERT(c_.isSet() && "ERROR: The Matrix C is not initialized");
    BOOST_ASSERT(q_.isSet() && "ERROR: The Matrix Q is not initialized");
    BOOST_ASSERT(r_.isSet() && "ERROR: The Matrix R is not initialized");
    BOOST_ASSERT(p_.isSet() && "ERROR: The Matrix P is not initialized");

    Amatrix a=a_();
    Cmatrix c=c_();
    Pmatrix px=p_();

    //prediction
    typename ObserverBase<n,m,p>::StateVector xbar=prediction_(k+1);
    Pmatrix pbar=a*px*a.transpose()+q_();

    //innovation
    typename ObserverBase<n,m,p>::MeasureVector ino= this->y_[0]() - simulateSensor_(xbar,k+1);
    Rmatrix inoCov = c * pbar * c.transpose() + r_();

    //gain
    Kmatrix kGain ((pbar * c.transpose()) * inoCov.inverse());

    //update
    typename ObserverBase<n,m,p>::StateVector xhat=xbar+kGain*ino;

    this->x_.set(xhat,k+1);
    p_.set((Pmatrix::Identity()-kGain*c)*pbar,k+1);

    return xhat;
}